

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

CBlock * CreateGenesisBlock(CBlock *__return_storage_ptr__,uint32_t nTime,uint32_t nNonce,
                           uint32_t nBits,int32_t nVersion,CAmount *genesisReward)

{
  long lVar1;
  CScript *this;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  CAmount *in_stack_ffffffffffffff30;
  byte local_b9 [65];
  undefined1 local_78 [32];
  CScript genesisOutputScript;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._16_8_ = 0;
  local_78._24_8_ = 0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = 0;
  memcpy(local_b9,util::hex_literals::detail::Hex<131ul>{std::array<std::byte_65ul>,0x41);
  b._M_extent._M_extent_value = 0x41;
  b._M_ptr = local_b9;
  this = CScript::operator<<((CScript *)local_78,b);
  other = &CScript::operator<<(this,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&genesisOutputScript.super_CScriptBase,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78);
  CreateGenesisBlock(__return_storage_ptr__,
                     "The Times 03/Jan/2009 Chancellor on brink of second bailout for banks",
                     &genesisOutputScript,nTime,nNonce,nBits,nVersion,in_stack_ffffffffffffff30);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&genesisOutputScript.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static CBlock CreateGenesisBlock(uint32_t nTime, uint32_t nNonce, uint32_t nBits, int32_t nVersion, const CAmount& genesisReward)
{
    const char* pszTimestamp = "The Times 03/Jan/2009 Chancellor on brink of second bailout for banks";
    const CScript genesisOutputScript = CScript() << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38c4f35504e51ec112de5c384df7ba0b8d578a4c702b6bf11d5f"_hex << OP_CHECKSIG;
    return CreateGenesisBlock(pszTimestamp, genesisOutputScript, nTime, nNonce, nBits, nVersion, genesisReward);
}